

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O0

int SUNNonlinSolSetSysFn_FixedPoint(SUNNonlinearSolver NLS,SUNNonlinSolSysFn SysFn)

{
  SUNNonlinSolSysFn SysFn_local;
  SUNNonlinearSolver NLS_local;
  int local_4;
  
  if (NLS == (SUNNonlinearSolver)0x0) {
    local_4 = -0x385;
  }
  else if (SysFn == (SUNNonlinSolSysFn)0x0) {
    local_4 = -0x387;
  }
  else {
    *(SUNNonlinSolSysFn *)NLS->content = SysFn;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int SUNNonlinSolSetSysFn_FixedPoint(SUNNonlinearSolver NLS, SUNNonlinSolSysFn SysFn)
{
  /* check that the nonlinear solver is non-null */
  if (NLS == NULL)
    return(SUN_NLS_MEM_NULL);

  /* check that the nonlinear system function is non-null */
  if (SysFn == NULL)
    return(SUN_NLS_ILL_INPUT);

  FP_CONTENT(NLS)->Sys = SysFn;
  return(SUN_NLS_SUCCESS);
}